

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall moira::Moira::dump32(Moira *this,char *str,u32 value)

{
  StrWriter *pSVar1;
  UInt32 local_64;
  StrWriter local_60;
  u32 local_1c;
  char *pcStack_18;
  u32 value_local;
  char *str_local;
  Moira *this_local;
  
  local_1c = value;
  pcStack_18 = str;
  str_local = (char *)this;
  StrWriter::StrWriter(&local_60,str,&this->dataStyle);
  UInt32::UInt32(&local_64,local_1c);
  pSVar1 = StrWriter::operator<<(&local_60,local_64);
  StrWriter::operator<<(pSVar1);
  return;
}

Assistant:

void
Moira::dump32(char *str, u32 value) const
{
    StrWriter(str, dataStyle) << UInt32{value} << Finish{};
}